

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::TranslateToFuzzReader
          (TranslateToFuzzReader *this,Module *wasm,vector<char,_std::allocator<char>_> *input,
          bool closedWorld)

{
  iterator __position;
  FuzzParamsContext *pFVar1;
  Random *this_00;
  byte bVar2;
  uint32_t uVar3;
  FuzzParamsContext *this_01;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  Type local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Random *local_50;
  double local_48;
  double dStack_40;
  
  this->wasm = wasm;
  this->closedWorld = closedWorld;
  (this->builder).wasm = wasm;
  local_50 = &this->random;
  Random::Random(local_50,input,(FeatureSet)(wasm->features).features);
  this->allowMemory = true;
  this->allowOOB = true;
  this->preserveImportsAndExports = false;
  *(undefined8 *)&this->LOGGING_PERCENT = 0;
  *(undefined8 *)((long)&(this->HANG_LIMIT_GLOBAL).super_IString.str._M_len + 4) = 0;
  *(undefined8 *)((long)&(this->HANG_LIMIT_GLOBAL).super_IString.str._M_str + 4) = 0;
  *(undefined8 *)((long)&(this->funcrefTableName).super_IString.str._M_len + 4) = 0;
  *(undefined8 *)((long)&(this->funcrefTableName).super_IString.str._M_str + 4) = 0;
  *(undefined8 *)((long)&(this->exnrefTableName).super_IString.str._M_len + 4) = 0;
  *(undefined4 *)((long)&(this->exnrefTableName).super_IString.str._M_str + 4) = 0;
  (this->logImportNames)._M_h._M_buckets = &(this->logImportNames)._M_h._M_single_bucket;
  (this->logImportNames)._M_h._M_bucket_count = 1;
  (this->logImportNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->logImportNames)._M_h._M_element_count = 0;
  (this->logImportNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->logImportNames)._M_h._M_rehash_policy._M_next_resize,0,0xa0);
  (this->globalsByType)._M_h._M_buckets = &(this->globalsByType)._M_h._M_single_bucket;
  (this->globalsByType)._M_h._M_bucket_count = 1;
  (this->globalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalsByType)._M_h._M_element_count = 0;
  (this->globalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mutableGlobalsByType)._M_h._M_buckets = &(this->mutableGlobalsByType)._M_h._M_single_bucket
  ;
  (this->mutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->mutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mutableGlobalsByType)._M_h._M_element_count = 0;
  (this->mutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->immutableGlobalsByType)._M_h._M_buckets =
       &(this->immutableGlobalsByType)._M_h._M_single_bucket;
  (this->immutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->immutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->immutableGlobalsByType)._M_h._M_element_count = 0;
  (this->immutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->immutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->immutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_buckets =
       &(this->importedImmutableGlobalsByType)._M_h._M_single_bucket;
  (this->importedImmutableGlobalsByType)._M_h._M_bucket_count = 1;
  (this->importedImmutableGlobalsByType)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_element_count = 0;
  (this->importedImmutableGlobalsByType)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interestingHeapTypes).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->importedImmutableGlobalsByType)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importedImmutableGlobalsByType)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->interestingHeapSubTypes)._M_h._M_buckets =
       &(this->interestingHeapSubTypes)._M_h._M_single_bucket;
  (this->interestingHeapSubTypes)._M_h._M_bucket_count = 1;
  (this->interestingHeapSubTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interestingHeapSubTypes)._M_h._M_element_count = 0;
  (this->interestingHeapSubTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interestingHeapSubTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interestingHeapSubTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeStructFields)._M_h._M_buckets = &(this->typeStructFields)._M_h._M_single_bucket;
  (this->typeStructFields)._M_h._M_bucket_count = 1;
  (this->typeStructFields)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeStructFields)._M_h._M_element_count = 0;
  (this->typeStructFields)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeStructFields)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeStructFields)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->typeArrays)._M_h._M_buckets = &(this->typeArrays)._M_h._M_single_bucket;
  (this->typeArrays)._M_h._M_bucket_count = 1;
  (this->typeArrays)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeArrays)._M_h._M_element_count = 0;
  (this->typeArrays)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->numAddedFunctions = 0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutableArrays).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mutableStructFields).
  super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->typeArrays)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeArrays)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalParams)._M_t.
  super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       (FuzzParamsContext *)0x0;
  this->nesting = 0;
  this->trivialNesting = 0;
  this->funcContext = (FunctionCreationContext *)0x0;
  this->fuzzParams = (FuzzParamsContext *)0x0;
  (this->trivialTag).super_IString.str._M_len = 0;
  (this->trivialTag).super_IString.str._M_str = (char *)0x0;
  local_78 = 4;
  uStack_70 = 5;
  local_88.id = 2;
  uStack_80 = 3;
  std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_assign_aux<wasm::Type_const*>
            ((vector<wasm::Type,std::allocator<wasm::Type>> *)&this->loggableTypes,&local_88);
  if (((wasm->features).features & 8) != 0) {
    local_88.id = 6;
    __position._M_current =
         (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                (&this->loggableTypes,__position,&local_88);
    }
    else {
      (__position._M_current)->id = 6;
      (this->loggableTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  this_01 = (FuzzParamsContext *)operator_new(0x58);
  (this_01->super_FuzzParams).USABLE_MEMORY.addr = 0;
  FuzzParams::setDefaults((FuzzParams *)this_01);
  this_01->parent = this;
  this_01->old = this->fuzzParams;
  this->fuzzParams = this_01;
  pFVar1 = (this->globalParams)._M_t.
           super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
           .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>.
           _M_head_impl;
  (this->globalParams)._M_t.
  super___uniq_ptr_impl<wasm::TranslateToFuzzReader::FuzzParamsContext,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_std::default_delete<wasm::TranslateToFuzzReader::FuzzParamsContext>_>
  .super__Head_base<0UL,_wasm::TranslateToFuzzReader::FuzzParamsContext_*,_false>._M_head_impl =
       this_01;
  if (pFVar1 != (FuzzParamsContext *)0x0) {
    pFVar1->parent->fuzzParams = pFVar1->old;
    operator_delete(pFVar1,0x58);
  }
  this_00 = local_50;
  uVar3 = Random::upTo(local_50,2);
  if (uVar3 == 0) {
    local_48 = 0.0;
    dStack_40 = 0.0;
    if ((this->random).finishedInput == false) {
      lVar4 = (long)(this->random).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)((this->random).bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + (this->random).pos);
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      dStack_40 = auVar7._8_8_ - 1.9342813113834067e+25;
      local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    }
    bVar2 = Random::get(this_00);
    local_48 = local_48 / 40960.0;
    if ((bVar2 & 1) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_NEW_GC_TYPES * local_48);
    }
    if ((bVar2 & 2) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_GLOBALS =
           (int)((double)(this->fuzzParams->super_FuzzParams).MAX_GLOBALS * local_48);
    }
    if ((bVar2 & 4) != 0) {
      iVar6 = (this->fuzzParams->super_FuzzParams).HANG_LIMIT;
      if (iVar6 != 0) {
        iVar5 = (int)((double)iVar6 * local_48);
        iVar6 = 1;
        if (1 < iVar5) {
          iVar6 = iVar5;
        }
        (this->fuzzParams->super_FuzzParams).HANG_LIMIT = iVar6;
      }
    }
    if (1.0 < local_48 && (bVar2 & 8) != 0) {
      (this->fuzzParams->super_FuzzParams).TRIES =
           (int)((double)(this->fuzzParams->super_FuzzParams).TRIES * local_48);
    }
    if ((bVar2 & 0x10) != 0) {
      (this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE =
           (int)(local_48 * (double)(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE);
    }
  }
  uVar3 = Random::upTo(this_00,2);
  this->allowAddingUnreachableCode = uVar3 == 0;
  return;
}

Assistant:

TranslateToFuzzReader::TranslateToFuzzReader(Module& wasm,
                                             std::vector<char>&& input,
                                             bool closedWorld)
  : wasm(wasm), closedWorld(closedWorld), builder(wasm),
    random(std::move(input), wasm.features) {

  // - funcref cannot be logged because referenced functions can be inlined or
  // removed during optimization
  // - there's no point in logging anyref because it is opaque
  // - don't bother logging tuples
  loggableTypes = {Type::i32, Type::i64, Type::f32, Type::f64};
  if (wasm.features.hasSIMD()) {
    loggableTypes.push_back(Type::v128);
  }

  // Setup params. Start with the defaults.
  globalParams = std::make_unique<FuzzParamsContext>(*this);

  // Some of the time, adjust parameters based on the size, e.g. allowing more
  // heap types in larger inputs, etc.
  if (random.oneIn(2)) {
    // A typical random wasm input from fuzz_opt.py is fairly large (to minimize
    // the process creation overhead of all the things we run from python), and
    // the defaults are tuned to that. This corresponds to INPUT_SIZE_MEAN in
    // scripts/fuzz_opt.py
    const double MEAN_SIZE = 40 * 1024;

    // As we have not read anything from the input, the remaining size is its
    // size.
    double size = random.remaining();
    auto ratio = size / MEAN_SIZE;

    auto bits = random.get();
    if (bits & 1) {
      fuzzParams->MAX_NEW_GC_TYPES *= ratio;
    }
    if (bits & 2) {
      fuzzParams->MAX_GLOBALS *= ratio;
    }
    if (bits & 4) {
      // Only adjust the limit if there is one.
      if (fuzzParams->HANG_LIMIT) {
        fuzzParams->HANG_LIMIT *= ratio;
        // There is a limit, so keep it non-zero to actually prevent hangs.
        fuzzParams->HANG_LIMIT = std::max(fuzzParams->HANG_LIMIT, 1);
      }
    }
    if (bits & 8) {
      // Only increase the number of tries. Trying fewer times does not help
      // find more interesting patterns.
      if (ratio > 1) {
        fuzzParams->TRIES *= ratio;
      }
    }
    if (bits & 16) {
      fuzzParams->MAX_ARRAY_SIZE *= ratio;
    }
  }

  // Half the time add no unreachable code so that we'll execute the most code
  // as possible with no early exits.
  allowAddingUnreachableCode = oneIn(2);
}